

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v5::internal::
          format_decimal<wchar_t,unsigned_long,wchar_t*,fmt::v5::internal::no_thousands_sep>
                    (wchar_t *out)

{
  char *__last;
  wchar_t *pwVar1;
  char_type buffer [26];
  char acStack_38 [40];
  
  __last = format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>(acStack_38);
  pwVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char*,wchar_t*>
                     (acStack_38,__last,out);
  return pwVar1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}